

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZydisFuzzEncoder.c
# Opt level: O1

void ZydisCompareRequestToInstruction
               (ZydisEncoderRequest *request,ZydisDecodedInstruction *insn,
               ZydisDecodedOperand *operands,ZyanU8 *insn_bytes)

{
  ZydisRegister ZVar1;
  ZydisInstructionCategory ZVar2;
  undefined4 uVar3;
  ulong uVar4;
  byte bVar5;
  ZyanStatus ZVar6;
  ZydisMnemonic *pZVar7;
  long lVar8;
  ZydisEncoderOperand *pZVar9;
  ulong uVar10;
  size_t __nbytes;
  ZydisDecodedOperand *pZVar11;
  ZyanU8 *pZVar12;
  ZydisOperandType ZVar13;
  ZydisEncoderRequest *decoder_00;
  byte bVar14;
  bool bVar15;
  ZydisDecoder decoder;
  ZydisDecodedInstruction knc_insn;
  ZydisDecodedOperand knc_operands [10];
  ZydisDecoder ZStack_aec;
  ZyanUSize ZStack_ae0;
  ZyanU8 aZStack_ad7 [15];
  ZydisEncoderRequest ZStack_ac8;
  ZydisDecodedInstruction ZStack_938;
  ZydisDecodedOperand aZStack_7f0 [10];
  ZydisEncoderRequest *pZStack_4d0;
  ZydisDecodedInstruction *pZStack_4c8;
  ZydisDecodedOperand *pZStack_4c0;
  undefined1 local_4b0 [20];
  ZydisMnemonic local_49c [81];
  ZydisDecodedOperand local_358 [10];
  
  pZVar7 = &insn->mnemonic;
  if ((((request->mnemonic == ZYDIS_MNEMONIC_XCHG) && (request->operand_count == '\x02')) &&
      (request->operands[0].type == ZYDIS_OPERAND_TYPE_REGISTER)) &&
     (((request->operands[1].type == ZYDIS_OPERAND_TYPE_REGISTER &&
       (ZVar1 = request->operands[0].reg.value, ZVar1 == request->operands[1].reg.value)) &&
      ((*pZVar7 == ZYDIS_MNEMONIC_NOP &&
       ((ZVar1 < ZYDIS_REGISTER_RCX && ((0x20002000200000U >> ((ulong)ZVar1 & 0x3f) & 1) != 0)))))))
     ) {
    return;
  }
  decoder_00 = request;
  if (request->mnemonic == *pZVar7) {
LAB_0010eb34:
    pZVar11 = (ZydisDecodedOperand *)request->prefixes;
    bVar15 = true;
    if (((ulong)pZVar11 & ~insn->attributes) != 0) {
      bVar15 = false;
      if ((((ulong)pZVar11 >> 0x27 & 1) != 0) &&
         (bVar15 = false, request->machine_mode != ZYDIS_MACHINE_MODE_LONG_64)) {
        pZVar11 = (ZydisDecodedOperand *)((ulong)pZVar11 & 0xffffff6fffffffff | 0x1000000000);
        bVar15 = ((ulong)pZVar11 & ~insn->attributes) == 0;
      }
    }
    if (((request->machine_mode == insn->machine_mode) && (request->mnemonic == *pZVar7)) &&
       ((bool)(request->operand_count == insn->operand_count_visible & bVar15))) {
      if (insn->operand_count_visible != '\0') {
        request = (ZydisEncoderRequest *)&request->operands[0].imm;
        bVar14 = 0;
        do {
          ZVar13 = *(ZydisOperandType *)&request[-1].operands[4].mem.size;
          if (ZVar13 != operands->type) {
            pZStack_4c0 = (ZydisDecodedOperand *)0x10ed38;
            ZydisCompareRequestToInstruction_cold_5();
LAB_0010ed38:
            pZStack_4c0 = (ZydisDecodedOperand *)0x10ed41;
            ZydisCompareRequestToInstruction_cold_7();
LAB_0010ed41:
            pZStack_4c0 = (ZydisDecodedOperand *)0x10ed4a;
            ZydisCompareRequestToInstruction_cold_6();
LAB_0010ed4a:
            pZStack_4c0 = (ZydisDecodedOperand *)0x10ed53;
            ZydisCompareRequestToInstruction_cold_9();
switchD_0010ebd9_default:
            pZStack_4c0 = (ZydisDecodedOperand *)0x10ed5c;
            ZydisCompareRequestToInstruction_cold_10();
LAB_0010ed5c:
            decoder_00 = (ZydisEncoderRequest *)(ulong)bVar14;
            pZStack_4c0 = (ZydisDecodedOperand *)0x10ed65;
            ZydisCompareRequestToInstruction_cold_8();
            goto LAB_0010ed65;
          }
          switch(ZVar13) {
          case ZYDIS_OPERAND_TYPE_REGISTER:
            if (*(ZydisMemoryOperandType *)&request[-1].operands[4].mem.field_0x1c !=
                (operands->field_10).mem.type) goto LAB_0010ed4a;
            break;
          case ZYDIS_OPERAND_TYPE_MEMORY:
            ZVar1 = *(ZydisRegister *)&request[-1].operands[4].imm;
            if ((((ZVar1 == (operands->field_10).mem.base) &&
                 (*(ZydisRegister *)((long)&request[-1].operands[4].imm + 4) ==
                  (operands->field_10).mem.index)) &&
                (((char)request[-1].evex.broadcast == (operands->field_10).mem.scale ||
                 ((operands->field_10).mem.type == ZYDIS_MEMOP_TYPE_MIB)))) &&
               (*(long *)&request[-1].evex.sae == (operands->field_10).mem.disp.value)) break;
            if (*(long *)&request[-1].evex.sae == (operands->field_10).mem.disp.value) {
              bVar15 = false;
            }
            else {
              if (((*(char *)((long)&operands->field_10 + 0x21) == '\0') ||
                  (*(int *)((long)&request[-1].operands[4].imm + 4) != 0)) ||
                 ((1 < ZVar1 - ZYDIS_REGISTER_EIP && (ZVar1 != ZYDIS_REGISTER_NONE)))) {
                bVar15 = false;
              }
              else {
                pZStack_4c0 = (ZydisDecodedOperand *)0x10ed0a;
                pZVar11 = operands;
                ZydisCalcAbsoluteAddress(insn,operands,0,(ZyanU64 *)local_4b0);
                bVar15 = *(ZyanU64 *)&request[-1].evex.sae == local_4b0._0_8_;
              }
              if ((((insn->machine_mode <
                     (ZYDIS_MACHINE_MODE_LEGACY_16|ZYDIS_MACHINE_MODE_LONG_COMPAT_16)) &&
                   ((0x34U >> (insn->machine_mode & 0x1f) & 1) != 0)) ||
                  (insn->stack_width == '\x10')) || (insn->address_width == '\x10')) {
                uVar3._0_1_ = request[-1].evex.sae;
                uVar3._1_1_ = request[-1].evex.zeroing_mask;
                uVar3._2_2_ = *(undefined2 *)&request[-1].evex.field_0xa;
                bVar15 = (short)*(undefined4 *)((long)&operands->field_10 + 0x18) == (short)uVar3;
              }
            }
            if (bVar15) break;
            goto LAB_0010ed5c;
          case ZYDIS_OPERAND_TYPE_POINTER:
            if (((short)request[-1].mvex.swizzle != (operands->field_10).ptr.segment) ||
               (ZVar1._0_1_ = request[-1].mvex.sae, ZVar1._1_1_ = request[-1].mvex.eviction_hint,
               ZVar1._2_2_ = *(undefined2 *)&request[-1].mvex.field_0x12,
               ZVar1 != (operands->field_10).mem.segment)) goto LAB_0010ed38;
            break;
          case ZYDIS_OPERAND_TYPE_IMMEDIATE:
            uVar10._0_4_ = request->machine_mode;
            uVar10._4_4_ = request->allowed_encodings;
            uVar4 = (operands->field_10).imm.value.u;
            if ((uVar10 != uVar4) &&
               (((ZVar2 = (insn->meta).category, ZVar2 != ZYDIS_CATEGORY_LOGICAL &&
                 (ZVar2 != ZYDIS_CATEGORY_DATAXFER)) ||
                ((0x3f < operands->size ||
                 (pZVar11 = (ZydisDecodedOperand *)~(-1L << ((byte)operands->size & 0x3f)),
                 ((uVar4 ^ uVar10) & (ulong)pZVar11) != 0)))))) goto LAB_0010ed41;
            break;
          default:
            goto switchD_0010ebd9_default;
          }
          bVar14 = bVar14 + 1;
          operands = operands + 1;
          request = (ZydisEncoderRequest *)&request->operands[0].mem;
        } while (bVar14 < insn->operand_count_visible);
      }
      return;
    }
LAB_0010ed65:
    pZStack_4c0 = (ZydisDecodedOperand *)0x10ed6a;
    ZydisCompareRequestToInstruction_cold_4();
LAB_0010ed6a:
    pZStack_4c0 = (ZydisDecodedOperand *)0x10ed6f;
    ZydisCompareRequestToInstruction_cold_1();
LAB_0010ed6f:
    insn_bytes = &pZVar11->id;
    pZStack_4c0 = (ZydisDecodedOperand *)0x10ed74;
    ZydisCompareRequestToInstruction_cold_2();
  }
  else {
    pZVar11 = (ZydisDecodedOperand *)(ulong)insn->machine_mode;
    decoder_00 = (ZydisEncoderRequest *)local_4b0;
    pZStack_4c0 = (ZydisDecodedOperand *)0x10eade;
    ZVar6 = ZydisDecoderInit((ZydisDecoder *)decoder_00,insn->machine_mode,
                             (uint)(insn->stack_width >> 5));
    if ((int)ZVar6 < 0) goto LAB_0010ed6a;
    decoder_00 = (ZydisEncoderRequest *)local_4b0;
    pZVar11 = (ZydisDecodedOperand *)0x2;
    pZStack_4c0 = (ZydisDecodedOperand *)0x10eafa;
    ZVar6 = ZydisDecoderEnableMode((ZydisDecoder *)decoder_00,ZYDIS_DECODER_MODE_KNC,'\x01');
    if ((int)ZVar6 < 0) goto LAB_0010ed6f;
    pZVar12 = &insn->length;
    decoder_00 = (ZydisEncoderRequest *)local_4b0;
    insn = (ZydisDecodedInstruction *)(local_4b0 + 0x10);
    operands = local_358;
    pZStack_4c0 = (ZydisDecodedOperand *)0x10eb27;
    ZVar6 = ZydisDecoderDecodeFull
                      ((ZydisDecoder *)decoder_00,insn_bytes,(ulong)*pZVar12,insn,operands);
    if (-1 < (int)ZVar6) {
      pZVar7 = local_49c;
      goto LAB_0010eb34;
    }
  }
  pZStack_4c0 = (ZydisDecodedOperand *)ZydisFuzzTarget;
  ZydisCompareRequestToInstruction_cold_3();
  pZStack_4d0 = request;
  pZStack_4c8 = insn;
  pZStack_4c0 = operands;
  lVar8 = (*(code *)decoder_00)(insn_bytes,&ZStack_ac8,400);
  if (lVar8 != 400) {
    ZydisFuzzTarget_cold_1();
    return;
  }
  bVar14 = ZStack_ac8.operand_count / 3 & 0xfe;
  ZStack_ac8.allowed_encodings = ZStack_ac8.allowed_encodings & ZYDIS_ENCODABLE_ENCODING_MAX_VALUE;
  ZStack_ac8.prefixes = ZStack_ac8.prefixes & 0x7fff8000000;
  ZStack_ac8.machine_mode = ZStack_ac8.machine_mode % 6;
  ZStack_ac8.mnemonic = ZStack_ac8.mnemonic % 0x704;
  ZStack_ac8.branch_type = ZStack_ac8.branch_type & ZYDIS_BRANCH_TYPE_FAR;
  ZStack_ac8.branch_width = ZStack_ac8.branch_width % 5;
  ZStack_ac8.address_size_hint = ZStack_ac8.address_size_hint & ZYDIS_ADDRESS_SIZE_HINT_64;
  ZStack_ac8.operand_size_hint = ZStack_ac8.operand_size_hint % 5;
  ZStack_ac8.evex.broadcast =
       ZStack_ac8.evex.broadcast -
       (ZStack_ac8.evex.broadcast / 0xd + (ZStack_ac8.evex.broadcast / 0xd) * 0xc);
  ZStack_ac8.evex.rounding = ZStack_ac8.evex.rounding % 5;
  ZStack_ac8.mvex.broadcast =
       ZStack_ac8.mvex.broadcast -
       (ZStack_ac8.mvex.broadcast / 0xd + (ZStack_ac8.mvex.broadcast / 0xd) * 0xc);
  ZStack_ac8.mvex.conversion = ZStack_ac8.mvex.conversion % 6;
  ZStack_ac8.mvex.rounding = ZStack_ac8.mvex.rounding % 5;
  ZStack_ac8.mvex.swizzle = ZStack_ac8.mvex.swizzle % 9;
  bVar5 = ZStack_ac8.operand_count + bVar14 * -3;
  if (bVar5 != 0) {
    pZVar9 = ZStack_ac8.operands;
    uVar10 = 0;
    do {
      ZVar13 = pZVar9->type & ZYDIS_OPERAND_TYPE_POINTER;
      pZVar9->type = ZVar13 + ZYDIS_OPERAND_TYPE_REGISTER;
      if (1 < ZVar13 - ZYDIS_OPERAND_TYPE_MEMORY) {
        lVar8 = 4;
        if (ZVar13 != ZYDIS_OPERAND_TYPE_UNUSED) {
          (pZVar9->mem).base = (pZVar9->mem).base % 0x10b;
          lVar8 = 0x14;
        }
        *(uint *)((long)&pZVar9->type + lVar8) = *(uint *)((long)&pZVar9->type + lVar8) % 0x10b;
      }
      uVar10 = uVar10 + 1;
      pZVar9 = pZVar9 + 1;
    } while (uVar10 < bVar5);
  }
  ZStack_ae0 = 0xf;
  ZStack_ac8.operand_count = ZStack_ac8.operand_count + bVar14 * -3;
  ZVar6 = ZydisEncoderEncodeInstruction(&ZStack_ac8,aZStack_ad7,&ZStack_ae0);
  if ((int)ZVar6 < 0) {
    return;
  }
  pZVar12 = (ZyanU8 *)(ulong)ZStack_ac8.machine_mode;
  if ((ZyanU8 *)0x5 < pZVar12) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/tools/ZydisFuzzEncoder.c"
                  ,0x118,"int ZydisFuzzTarget(ZydisStreamRead, void *)");
  }
  ZVar6 = ZydisDecoderInit(&ZStack_aec,ZStack_ac8.machine_mode,
                           *(ZydisStackWidth *)(&DAT_00125014 + (long)pZVar12 * 4));
  if ((int)ZVar6 < 0) {
    ZydisFuzzTarget_cold_2();
  }
  else {
    if ((ZStack_ac8.mnemonic == ZYDIS_MNEMONIC_UD0) && (ZStack_ac8.operand_count == '\0')) {
      pZVar12 = (ZyanU8 *)0xa;
      ZVar6 = ZydisDecoderEnableMode(&ZStack_aec,ZYDIS_DECODER_MODE_MAX_VALUE,'\x01');
      if ((int)ZVar6 < 0) goto LAB_0010f0ac;
    }
    pZVar12 = aZStack_ad7;
    ZVar6 = ZydisDecoderDecodeFull(&ZStack_aec,pZVar12,ZStack_ae0,&ZStack_938,aZStack_7f0);
    if (-1 < (int)ZVar6) {
      ZydisCompareRequestToInstruction(&ZStack_ac8,&ZStack_938,aZStack_7f0,aZStack_ad7);
      ZydisReEncodeInstruction
                (&ZStack_aec,&ZStack_938,aZStack_7f0,ZStack_938.operand_count,aZStack_ad7);
      return;
    }
  }
  ZydisFuzzTarget_cold_4();
LAB_0010f0ac:
  ZydisFuzzTarget_cold_3();
  read(0,pZVar12,__nbytes);
  return;
}

Assistant:

void ZydisCompareRequestToInstruction(const ZydisEncoderRequest *request,
    const ZydisDecodedInstruction *insn, const ZydisDecodedOperand* operands, const ZyanU8 *insn_bytes)
{
    // Special case, `xchg rAX, rAX` is an alias for `NOP`
    if ((request->mnemonic == ZYDIS_MNEMONIC_XCHG) &&
        (request->operand_count == 2) &&
        (request->operands[0].type == ZYDIS_OPERAND_TYPE_REGISTER) &&
        (request->operands[1].type == ZYDIS_OPERAND_TYPE_REGISTER) &&
        (request->operands[0].reg.value == request->operands[1].reg.value) &&
        (insn->mnemonic == ZYDIS_MNEMONIC_NOP))
    {
        switch (request->operands[0].reg.value)
        {
        case ZYDIS_REGISTER_AX:
        case ZYDIS_REGISTER_EAX:
        case ZYDIS_REGISTER_RAX:
            return;
        default:
            break;
        }
    }

    // Handle possible KNC overlap
    ZydisDecodedInstruction knc_insn;
    ZydisDecodedOperand knc_operands[ZYDIS_MAX_OPERAND_COUNT];
    if (request->mnemonic != insn->mnemonic)
    {
        ZydisDecoder decoder;
        ZydisStackWidth stack_width = (ZydisStackWidth)(insn->stack_width >> 5);
        if (!ZYAN_SUCCESS(ZydisDecoderInit(&decoder, insn->machine_mode, stack_width)))
        {
            fputs("Failed to initialize decoder\n", ZYAN_STDERR);
            abort();
        }
        if (!ZYAN_SUCCESS(ZydisDecoderEnableMode(&decoder, ZYDIS_DECODER_MODE_KNC, ZYAN_TRUE)))
        {
            fputs("Failed to enable KNC mode\n", ZYAN_STDERR);
            abort();
        }
        if (!ZYAN_SUCCESS(ZydisDecoderDecodeFull(&decoder, insn_bytes, insn->length, &knc_insn,
            knc_operands)))
        {
            fputs("Failed to decode instruction\n", ZYAN_STDERR);
            abort();
        }
        insn = &knc_insn;
        operands = knc_operands;
    }

    ZyanBool prefixes_match = ((insn->attributes & request->prefixes) == request->prefixes);
    if (!prefixes_match &&
        (request->machine_mode != ZYDIS_MACHINE_MODE_LONG_64) &&
        (request->prefixes & ZYDIS_ATTRIB_HAS_SEGMENT_DS))
    {
        // Encoder allows specifying DS override even when it might be interpreted as NOTRACK
        ZyanU64 acceptable_prefixes = (request->prefixes & (~ZYDIS_ATTRIB_HAS_SEGMENT_DS)) |
                                      ZYDIS_ATTRIB_HAS_NOTRACK;
        prefixes_match = ((insn->attributes & acceptable_prefixes) == acceptable_prefixes);
    }
    if ((request->machine_mode != insn->machine_mode) ||
        (request->mnemonic != insn->mnemonic) ||
        (request->operand_count != insn->operand_count_visible) ||
        !prefixes_match)
    {
        fputs("Basic instruction attributes mismatch\n", ZYAN_STDERR);
        abort();
    }

    for (ZyanU8 i = 0; i < insn->operand_count_visible; ++i)
    {
        const ZydisEncoderOperand *op1 = &request->operands[i];
        const ZydisDecodedOperand *op2 = &operands[i];
        if (op1->type != op2->type)
        {
            fprintf(ZYAN_STDERR, "Mismatch for operand %u\n", i);
            abort();
        }
        switch (op1->type)
        {
        case ZYDIS_OPERAND_TYPE_REGISTER:
            if (op1->reg.value != op2->reg.value)
            {
                fprintf(ZYAN_STDERR, "Mismatch for register operand %u\n", i);
                abort();
            }
            break;
        case ZYDIS_OPERAND_TYPE_MEMORY:
            if ((op1->mem.base != op2->mem.base) ||
                (op1->mem.index != op2->mem.index) ||
                (op1->mem.scale != op2->mem.scale && op2->mem.type != ZYDIS_MEMOP_TYPE_MIB) ||
                (op1->mem.displacement != op2->mem.disp.value))
            {
                ZyanBool acceptable_mismatch = ZYAN_FALSE;
                if (op1->mem.displacement != op2->mem.disp.value)
                {
                    if ((op2->mem.disp.size) &&
                        (op1->mem.index == ZYDIS_REGISTER_NONE) &&
                        ((op1->mem.base == ZYDIS_REGISTER_NONE) ||
                         (op1->mem.base == ZYDIS_REGISTER_EIP) ||
                         (op1->mem.base == ZYDIS_REGISTER_RIP)))
                    {
                        ZyanU64 addr;
                        ZydisCalcAbsoluteAddress(insn, op2, 0, &addr);
                        acceptable_mismatch = ((ZyanU64)op1->mem.displacement == addr);
                    }
                    if ((insn->machine_mode == ZYDIS_MACHINE_MODE_REAL_16) ||
                        (insn->machine_mode == ZYDIS_MACHINE_MODE_LEGACY_16) ||
                        (insn->machine_mode == ZYDIS_MACHINE_MODE_LONG_COMPAT_16) ||
                        (insn->stack_width == 16) ||
                        (insn->address_width == 16))
                    {
                        acceptable_mismatch = ((op1->mem.displacement & 0xFFFF) ==
                            (op2->mem.disp.value & 0xFFFF));
                    }
                }
                if (!acceptable_mismatch)
                {
                    fprintf(ZYAN_STDERR, "Mismatch for memory operand %u\n", i);
                    abort();
                }
            }
            break;
        case ZYDIS_OPERAND_TYPE_POINTER:
            if ((op1->ptr.segment != op2->ptr.segment) ||
                (op1->ptr.offset != op2->ptr.offset))
            {
                fprintf(ZYAN_STDERR, "Mismatch for pointer operand %u\n", i);
                abort();
            }
            break;
        case ZYDIS_OPERAND_TYPE_IMMEDIATE:
            if (op1->imm.u != op2->imm.value.u)
            {
                ZyanBool acceptable_mismatch = ZYAN_FALSE;
                if ((insn->meta.category == ZYDIS_CATEGORY_DATAXFER) ||
                    (insn->meta.category == ZYDIS_CATEGORY_LOGICAL))
                {
                    if (op2->size < 64)
                    {
                        ZyanU64 mask = (1ULL << op2->size) - 1;
                        acceptable_mismatch =
                            (op1->imm.u & mask) == (op2->imm.value.u & mask);
                    }
                    else
                    {
                        acceptable_mismatch = op1->imm.u == op2->imm.value.u;
                    }
                }
                if (!acceptable_mismatch)
                {
                    fprintf(ZYAN_STDERR, "Mismatch for immediate operand %u\n", i);
                    abort();
                }
            }
            break;
        default:
            fprintf(ZYAN_STDERR, "Invalid operand type for operand %u\n", i);
            abort();
        }
    }
}